

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  cmMakefile *this_00;
  cmMakefile *this_01;
  char cVar2;
  _Alloc_hider _Var3;
  undefined1 this_02 [8];
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar10;
  uint uVar11;
  char *pcVar12;
  pointer filename_00;
  string *psVar13;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  ostringstream cmCPackLog_msg;
  string tmpPF;
  string filename;
  ostringstream cmCPackLog_msg_15;
  string hashFile;
  string findExpr;
  Glob gl;
  undefined1 auStack_4e8 [14];
  byte local_4da;
  allocator<char> local_4d9;
  string local_4d8;
  string *local_4b8;
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [8];
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  uint auStack_488 [20];
  ios_base local_438 [136];
  ios_base local_3b0 [264];
  string local_2a8;
  string local_288;
  string local_268 [3];
  ios_base local_1f8 [264];
  char *local_f0;
  char *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  undefined8 local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  pointer local_b0;
  string local_a8;
  Glob local_88;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4a8,"Create package using ",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_4a8,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var3._M_p = local_268[0]._M_dataplus._M_p;
  sVar7 = strlen(local_268[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3bd,_Var3._M_p,sVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
    operator_delete(local_268[0]._M_dataplus._M_p,
                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                             local_268[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
  std::ios_base::~ios_base(local_438);
  iVar5 = PrepareNames(this);
  uVar11 = 0;
  if ((iVar5 != 0) && (iVar5 = (*this->_vptr_cmCPackGenerator[6])(this), uVar11 = 0, iVar5 != 0)) {
    local_4a8 = (undefined1  [8])&local_498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
    pcVar8 = GetOption(this,(string *)local_4a8);
    bVar4 = cmSystemTools::IsOn(pcVar8);
    if (local_4a8 != (undefined1  [8])&local_498) {
      operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
    }
    if (bVar4) {
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar8 = GetOption(this,(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
      }
      bVar4 = cmsys::SystemTools::FileExists(pcVar8);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,"Remove toplevel directory: ",0x1b);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4a8 + -0x18) + 0x40);
        }
        else {
          sVar7 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar8,sVar7);
        }
        std::ios::widen((char)(ostringstream *)local_4a8 +
                        (char)*(undefined8 *)((long)local_4a8 + -0x18));
        std::ostream::put((char)local_4a8);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var3._M_p = local_268[0]._M_dataplus._M_p;
        sVar7 = strlen(local_268[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3d1,_Var3._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
        std::ios_base::~ios_base(local_438);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a8,pcVar8,(allocator<char> *)local_268);
        bVar4 = cmSystemTools::RepeatedRemoveDirectory((string *)local_4a8);
        if (local_4a8 != (undefined1  [8])&local_498) {
          operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8,"Problem removing toplevel directory: ",0x25);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4a8 + -0x18) + 0x40)
            ;
          }
          else {
            sVar7 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar8,sVar7);
          }
          std::ios::widen((char)(ostringstream *)local_4a8 +
                          (char)*(undefined8 *)((long)local_4a8 + -0x18));
          std::ostream::put((char)local_4a8);
          std::ostream::flush();
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_268[0]._M_dataplus._M_p;
          sVar7 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3d5,_Var3._M_p,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::ios_base::~ios_base(local_438);
          return 0;
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4a8,"About to install project ",0x19);
    std::ios::widen((char)(ostringstream *)local_4a8 +
                    (char)*(undefined8 *)((long)local_4a8 + -0x18));
    std::ostream::put((char)local_4a8);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var3._M_p = local_268[0]._M_dataplus._M_p;
    sVar7 = strlen(local_268[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3db,_Var3._M_p,sVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    iVar5 = InstallProject(this);
    if (iVar5 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4a8,"Done install project ",0x15);
      std::ios::widen((char)(ostringstream *)local_4a8 +
                      (char)*(undefined8 *)((long)local_4a8 + -0x18));
      std::ostream::put((char)local_4a8);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var3._M_p = local_268[0]._M_dataplus._M_p;
      sVar7 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3e0,_Var3._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::ios_base::~ios_base(local_438);
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)GetOption(this,(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
      }
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"CPACK_TEMPORARY_DIRECTORY","");
      pcVar8 = GetOption(this,(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"Find files",10);
      std::ios::widen((char)(ostringstream *)local_4a8 +
                      (char)*(undefined8 *)((long)local_4a8 + -0x18));
      std::ostream::put((char)local_4a8);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var3._M_p = local_268[0]._M_dataplus._M_p;
      sVar7 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3e6,_Var3._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::ios_base::~ios_base(local_438);
      cmsys::Glob::Glob(&local_88);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,pcVar8,(allocator<char> *)local_4a8);
      std::__cxx11::string::append((char *)&local_a8);
      local_88.Recurse = true;
      local_88.RecurseListDirs = true;
      local_88.RecurseThroughSymlinks = false;
      bVar4 = cmsys::Glob::FindFiles(&local_88,&local_a8,(GlobMessages *)0x0);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,"Create package",0xe);
        std::ios::widen((char)(ostream *)local_4a8 + (char)*(undefined8 *)((long)local_4a8 + -0x18))
        ;
        std::ostream::put((char)local_4a8);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var3._M_p = local_268[0]._M_dataplus._M_p;
        sVar7 = strlen(local_268[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3f3,_Var3._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
        std::ios_base::~ios_base(local_438);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,"Package files to: ",0x12);
        pcVar12 = (char *)paVar9;
        if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          pcVar12 = "(NULL)";
        }
        sVar7 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar12,sVar7);
        std::ios::widen((char)(ostream *)local_4a8 + (char)*(undefined8 *)((long)local_4a8 + -0x18))
        ;
        std::ostream::put((char)local_4a8);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var3._M_p = local_268[0]._M_dataplus._M_p;
        sVar7 = strlen(local_268[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3f7,_Var3._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
        std::ios_base::~ios_base(local_438);
        bVar4 = cmsys::SystemTools::FileExists(paVar9->_M_local_buf);
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8,"Remove old package file",0x17);
          std::ios::widen((char)(ostream *)local_4a8 +
                          (char)*(undefined8 *)((long)local_4a8 + -0x18));
          std::ostream::put((char)local_4a8);
          std::ostream::flush();
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_268[0]._M_dataplus._M_p;
          sVar7 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3fa,_Var3._M_p,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::ios_base::~ios_base(local_438);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4a8,paVar9->_M_local_buf,(allocator<char> *)local_268);
          cmsys::SystemTools::RemoveFile((string *)local_4a8);
          if (local_4a8 != (undefined1  [8])&local_498) {
            operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
          }
        }
        local_4a8 = (undefined1  [8])&local_498;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4a8,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
        pcVar12 = GetOption(this,(string *)local_4a8);
        bVar4 = cmSystemTools::IsOn(pcVar12);
        if (local_4a8 != (undefined1  [8])&local_498) {
          operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_4a8 = (undefined1  [8])&local_498;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"CPACK_TOPLEVEL_DIRECTORY","");
          pcVar8 = GetOption(this,(string *)local_4a8);
          if (local_4a8 != (undefined1  [8])&local_498) {
            operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
          }
        }
        __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->files,__x);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&this->packageFileNames,
                          (this->packageFileNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5822d2;
        }
        local_4a8 = (undefined1  [8])paVar9;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->packageFileNames,(char **)local_4a8);
        pcVar12 = (char *)(this->toplevel)._M_string_length;
        strlen(pcVar8);
        std::__cxx11::string::_M_replace((ulong)&this->toplevel,0,pcVar12,(ulong)pcVar8);
        this_00 = this->MakefileMap;
        cmMakefile::PushScope(this_00);
        this_01 = this->MakefileMap;
        pcVar8 = cmVersion::GetCMakeVersion();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a8,pcVar8,(allocator<char> *)&local_2a8);
        local_268[0]._M_string_length = 0;
        local_268[0].field_2._M_local_buf[0] = '\0';
        local_268[0]._M_dataplus._M_p = (pointer)&local_268[0].field_2;
        cmMakefile::SetPolicyVersion(this_01,(string *)local_4a8,local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        if (local_4a8 != (undefined1  [8])&local_498) {
          operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
        }
        iVar5 = (*this->_vptr_cmCPackGenerator[9])(this);
        if ((((iVar5 == 0) || (cmSystemTools::s_ErrorOccured != false)) ||
            (cmSystemTools::s_FatalErrorOccured != false)) ||
           (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8,"Problem compressing the directory",0x21);
          std::ios::widen((char)(ostream *)local_4a8 +
                          (char)*(undefined8 *)((long)local_4a8 + -0x18));
          std::ostream::put((char)local_4a8);
          std::ostream::flush();
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_268[0]._M_dataplus._M_p;
          sVar7 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x416,_Var3._M_p,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::ios_base::~ios_base(local_438);
          uVar11 = 0;
          cmMakefile::PopScope(this_00);
        }
        else {
          cmMakefile::PopScope(this_00);
          local_4a8 = (undefined1  [8])&local_498;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"CPACK_PACKAGE_CHECKSUM","");
          local_f0 = GetOption(this,(string *)local_4a8);
          if (local_4a8 != (undefined1  [8])&local_498) {
            operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
          }
          pcVar8 = "";
          if (local_f0 != (char *)0x0) {
            pcVar8 = local_f0;
          }
          cmCryptoHash::New((cmCryptoHash *)local_4b0,pcVar8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8,"Copying final package(s) [",0x1a);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]:",2);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_268[0]._M_dataplus._M_p;
          sVar7 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x427,_Var3._M_p,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
          std::ios_base::~ios_base(local_438);
          filename_00 = (this->packageFileNames).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_b0 = (this->packageFileNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          bVar4 = filename_00 == local_b0;
          uVar11 = (uint)bVar4;
          if (!bVar4) {
            local_b8 = _VTT;
            local_c0 = _vtable;
            do {
              local_4da = bVar4;
              local_4a8 = (undefined1  [8])&local_498;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4a8,"CPACK_OUTPUT_FILE_PREFIX","");
              pcVar8 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4a8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a8,pcVar8,(allocator<char> *)local_268);
              if (local_4a8 != (undefined1  [8])&local_498) {
                operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
              }
              cmsys::SystemTools::GetFilenameName(&local_288,filename_00);
              pcVar8 = (filename_00->_M_dataplus)._M_p;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4a8,"/",&local_288);
              std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_4a8);
              if (local_4a8 != (undefined1  [8])&local_498) {
                operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
              }
              _Var3._M_p = local_2a8._M_dataplus._M_p;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"Copy final package(s): ",0x17);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "(NULL)";
              }
              sVar7 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar8,sVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8," to ",4);
              pcVar12 = _Var3._M_p;
              if (_Var3._M_p == (char *)0x0) {
                pcVar12 = "(NULL)";
              }
              sVar7 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar12,sVar7)
              ;
              cVar2 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4a8;
              std::ios::widen((char)*(undefined8 *)((long)local_4a8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              local_e8 = _Var3._M_p;
              pcVar1 = this->Logger;
              local_4b8 = filename_00;
              std::__cxx11::stringbuf::str();
              _Var3._M_p = local_268[0]._M_dataplus._M_p;
              sVar7 = strlen(local_268[0]._M_dataplus._M_p);
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x433,_Var3._M_p,sVar7);
              psVar13 = local_4b8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                operator_delete(local_268[0]._M_dataplus._M_p,
                                CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                         local_268[0].field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              std::ios_base::~ios_base(local_438);
              bVar4 = cmsys::SystemTools::CopyFileIfDifferent(psVar13,&local_2a8);
              if (!bVar4) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"Problem copying the package: ",0x1d);
                sVar7 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,pcVar8,sVar7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8," to ",4);
                sVar7 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,pcVar12,sVar7);
                std::endl<char,std::char_traits<char>>((ostream *)local_4a8);
                pcVar1 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var3._M_p = local_268[0]._M_dataplus._M_p;
                sVar7 = strlen(local_268[0]._M_dataplus._M_p);
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x439,_Var3._M_p,sVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                  operator_delete(local_268[0]._M_dataplus._M_p,
                                  CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                           local_268[0].field_2._M_local_buf[0]) + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                std::ios_base::~ios_base(local_438);
LAB_00153277:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p,
                                  local_2a8.field_2._M_allocated_capacity + 1);
                }
                uVar11 = (uint)local_4da;
                break;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"- package: ",0xb);
              pcVar8 = local_e8;
              if (local_e8 == (char *)0x0) {
                std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4a8 + -0x18) +
                                0x40);
              }
              else {
                sVar7 = strlen(local_e8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,pcVar8,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8," generated.",0xb);
              std::ios::widen((char)*(undefined8 *)((long)local_4a8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var3._M_p = local_268[0]._M_dataplus._M_p;
              sVar7 = strlen(local_268[0]._M_dataplus._M_p);
              cmCPackLog::Log(pcVar1,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x43e,_Var3._M_p,sVar7);
              psVar13 = local_4b8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                operator_delete(local_268[0]._M_dataplus._M_p,
                                CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                         local_268[0].field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              std::ios_base::~ios_base(local_438);
              if (local_4b0 != (undefined1  [8])0x0) {
                local_4a8 = (undefined1  [8])&local_498;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4a8,"CPACK_OUTPUT_FILE_PREFIX","");
                pcVar8 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_4a8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e0,pcVar8,(allocator<char> *)local_268);
                if (local_4a8 != (undefined1  [8])&local_498) {
                  operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4a8,"/",&local_288);
                std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_4a8);
                if (local_4a8 != (undefined1  [8])&local_498) {
                  operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d8,local_f0,&local_4d9);
                cmsys::SystemTools::LowerCase(local_268,&local_4d8);
                plVar10 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_268,0,(char *)0x0,0x5600ce);
                local_4a8 = (undefined1  [8])&local_498;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 == paVar9) {
                  local_498._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_498._8_8_ = plVar10[3];
                }
                else {
                  local_498._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_4a8 = (undefined1  [8])*plVar10;
                }
                local_4a0 = plVar10[1];
                *plVar10 = (long)paVar9;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_4a8);
                if (local_4a8 != (undefined1  [8])&local_498) {
                  operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                  operator_delete(local_268[0]._M_dataplus._M_p,
                                  CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                           local_268[0].field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                std::ofstream::ofstream
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4a8,(char *)local_e0,_S_out);
                this_02 = local_4b0;
                uVar11 = *(uint *)((long)auStack_488 + *(long *)((long)local_4a8 + -0x18));
                if ((uVar11 & 5) == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4d8,local_e8,&local_4d9);
                  cmCryptoHash::HashFile(local_268,(cmCryptoHash *)this_02,&local_4d8);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_4a8,local_268[0]._M_dataplus._M_p,
                                      local_268[0]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,local_288._M_dataplus._M_p,local_288._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                    operator_delete(local_268[0]._M_dataplus._M_p,
                                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                             local_268[0].field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                    operator_delete(local_4d8._M_dataplus._M_p,
                                    local_4d8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,"- checksum file: ",0x11);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_268,(char *)local_e0,local_d8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," generated.",0xb);
                  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  pcVar1 = this->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var3._M_p = local_4d8._M_dataplus._M_p;
                  sVar7 = strlen(local_4d8._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar1,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x44f,_Var3._M_p,sVar7);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,"Cannot create checksum file: ",0x1d);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_268,(char *)local_e0,local_d8);
                  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  pcVar1 = this->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var3._M_p = local_4d8._M_dataplus._M_p;
                  sVar7 = strlen(local_4d8._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar1,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x449,_Var3._M_p,sVar7);
                }
                psVar13 = local_4b8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                std::ios_base::~ios_base(local_1f8);
                local_4a8 = (undefined1  [8])local_b8;
                *(undefined8 *)(local_4a8 + (&local_b8->_M_allocated_capacity)[-3]) = local_c0;
                std::filebuf::~filebuf((filebuf *)&local_4a0);
                std::ios_base::~ios_base(local_3b0);
                if (local_e0 != local_d0) {
                  operator_delete(local_e0,local_d0[0] + 1);
                }
                if ((uVar11 & 5) != 0) goto LAB_00153277;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                local_288.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              filename_00 = psVar13 + 1;
              bVar4 = filename_00 == local_b0;
              uVar11 = (uint)bVar4;
            } while (!bVar4);
          }
          uVar11 = uVar11 & 1;
          std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                    ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_4b0);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,"Cannot find any files in the packaging tree",0x2b);
        std::ios::widen((char)(ostream *)local_4a8 + (char)*(undefined8 *)((long)local_4a8 + -0x18))
        ;
        std::ostream::put((char)local_4a8);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var3._M_p = local_268[0]._M_dataplus._M_p;
        sVar7 = strlen(local_268[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3ef,_Var3._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
        std::ios_base::~ios_base(local_438);
        uVar11 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      cmsys::Glob::~Glob(&local_88);
    }
  }
  return uVar11;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    const char* toplevelDirectory =
      this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  const char* tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.emplace_back(tempPackageFileName ? tempPackageFileName
                                                    : "");
  toplevel = tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }

  /* Prepare checksum algorithm*/
  const char* algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(algo ? algo : "");

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = pkgFileName.c_str();
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}